

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  pthread_mutex_t *__mutex;
  _func_int **pp_Var1;
  int iVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  long *in_RSI;
  long in_FS_OFFSET;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = (mutex_type *)((ulong)local_40._M_device & 0xffffffffffffff00);
  (**(code **)(*in_RSI + 0x20))();
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    __mutex = (pthread_mutex_t *)(in_RSI + 0x19);
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar4 = std::__throw_system_error(iVar2);
        pthread_mutex_unlock(__mutex);
        pp_Var3 = (this->super_DB)._vptr_DB;
        if (pp_Var3 != (_func_int **)0x0) {
          operator_delete__(pp_Var3);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(uVar4);
        }
      }
      goto LAB_0063a120;
    }
    if (in_RSI[0x27] != 0) {
      do {
        pp_Var3 = (_func_int **)in_RSI[0x46];
        if (pp_Var3 != (_func_int **)0x0) {
          pp_Var1 = (this->super_DB)._vptr_DB;
          if (pp_Var1 != pp_Var3) {
            if (pp_Var1 == (_func_int **)0x0) {
LAB_0063a097:
              pp_Var3 = (_func_int **)Status::CopyState((char *)pp_Var3);
            }
            else {
              operator_delete__(pp_Var1);
              pp_Var3 = (_func_int **)in_RSI[0x46];
              if (pp_Var3 != (_func_int **)0x0) goto LAB_0063a097;
              pp_Var3 = (_func_int **)0x0;
            }
            (this->super_DB)._vptr_DB = pp_Var3;
          }
          break;
        }
        local_40._M_device = (mutex_type *)in_RSI[0x25];
        local_40._M_owns = true;
        std::condition_variable::wait((unique_lock *)(in_RSI + 0x1f));
        local_40._M_device = (mutex_type *)0x0;
        local_40._M_owns = false;
        std::unique_lock<std::mutex>::~unique_lock(&local_40);
      } while (in_RSI[0x27] != 0);
    }
    pthread_mutex_unlock(__mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
LAB_0063a120:
  __stack_chk_fail();
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}